

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testapi.c
# Opt level: O0

int test_xinclude(void)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  uint uVar13;
  int test_ret;
  
  if (quiet == 0) {
    printf("Testing xinclude : 9 of 13 functions ...\n");
  }
  iVar1 = test_xmlXIncludeGetLastError();
  iVar2 = test_xmlXIncludeNewContext();
  iVar3 = test_xmlXIncludeProcess();
  iVar4 = test_xmlXIncludeProcessFlags();
  iVar5 = test_xmlXIncludeProcessFlagsData();
  iVar6 = test_xmlXIncludeProcessNode();
  iVar7 = test_xmlXIncludeProcessTree();
  iVar8 = test_xmlXIncludeProcessTreeFlags();
  iVar9 = test_xmlXIncludeProcessTreeFlagsData();
  iVar10 = test_xmlXIncludeSetErrorHandler();
  iVar11 = test_xmlXIncludeSetFlags();
  iVar12 = test_xmlXIncludeSetResourceLoader();
  uVar13 = iVar12 + iVar11 + iVar10 + iVar9 + iVar8 + iVar7 + iVar6 + iVar5 + iVar4 + iVar3 + iVar2 
                                                  + iVar1;
  if (uVar13 != 0) {
    printf("Module xinclude: %d errors\n",(ulong)uVar13);
  }
  return uVar13;
}

Assistant:

static int
test_xinclude(void) {
    int test_ret = 0;

    if (quiet == 0) printf("Testing xinclude : 9 of 13 functions ...\n");
    test_ret += test_xmlXIncludeGetLastError();
    test_ret += test_xmlXIncludeNewContext();
    test_ret += test_xmlXIncludeProcess();
    test_ret += test_xmlXIncludeProcessFlags();
    test_ret += test_xmlXIncludeProcessFlagsData();
    test_ret += test_xmlXIncludeProcessNode();
    test_ret += test_xmlXIncludeProcessTree();
    test_ret += test_xmlXIncludeProcessTreeFlags();
    test_ret += test_xmlXIncludeProcessTreeFlagsData();
    test_ret += test_xmlXIncludeSetErrorHandler();
    test_ret += test_xmlXIncludeSetFlags();
    test_ret += test_xmlXIncludeSetResourceLoader();

    if (test_ret != 0)
	printf("Module xinclude: %d errors\n", test_ret);
    return(test_ret);
}